

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  char cVar4;
  undefined8 uVar5;
  uint uVar6;
  size_t sVar7;
  seqDef *psVar8;
  uint uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  U32 UVar19;
  ulong uVar20;
  BYTE *litEnd;
  ulong uVar21;
  int *iend;
  BYTE *litEnd_1;
  U32 UVar22;
  U32 UVar23;
  size_t offbaseFound;
  BYTE *litLimit_w;
  U32 local_b0;
  size_t local_a0;
  BYTE *local_98;
  uint local_8c;
  ulong local_88;
  int *local_80;
  uint local_74;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  uint local_58;
  int local_54;
  U32 *local_50;
  BYTE *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  pBVar2 = (ms->window).base;
  local_58 = (ms->window).dictLimit;
  local_88 = (ulong)local_58;
  local_60 = pBVar2 + local_88;
  local_8c = (ms->cParams).minMatch;
  if (5 < local_8c) {
    local_8c = 6;
  }
  if (local_8c < 5) {
    local_8c = 4;
  }
  local_74 = (ms->cParams).searchLog;
  uVar18 = 6;
  if (local_74 < 6) {
    uVar18 = local_74;
  }
  if (uVar18 < 5) {
    uVar18 = 4;
  }
  pZVar3 = ms->dictMatchState;
  local_48 = (pZVar3->window).base;
  local_38 = local_48 + (pZVar3->window).dictLimit;
  local_68 = (pZVar3->window).nextSrc;
  piVar13 = (int *)((ulong)(((int)src - ((int)local_60 + (int)local_38)) + (int)local_68 == 0) +
                   (long)src);
  UVar23 = *rep;
  local_b0 = rep[1];
  ms->lazySkipping = 0;
  local_80 = (int *)((long)src + (srcSize - 0x10));
  uVar6 = ms->nextToUpdate;
  uVar16 = (ulong)uVar6;
  uVar17 = ((int)local_80 - (int)(pBVar2 + uVar16)) + 1;
  uVar9 = 8;
  if (uVar17 < 8) {
    uVar9 = uVar17;
  }
  if (local_80 < pBVar2 + uVar16) {
    uVar9 = 0;
  }
  if (uVar6 < uVar9 + uVar6) {
    uVar14 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_8c == 5) {
        uVar21 = *(long *)(pBVar2 + uVar16) * -0x30e4432345000000;
LAB_01d2c0b9:
        UVar22 = (U32)((uVar21 ^ uVar14) >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (local_8c == 6) {
          uVar21 = *(long *)(pBVar2 + uVar16) * -0x30e4432340650000;
          goto LAB_01d2c0b9;
        }
        UVar22 = (*(int *)(pBVar2 + uVar16) * -0x61c8864f ^ (uint)uVar14) >> (0x18U - cVar4 & 0x1f);
      }
      ms->hashCache[(uint)uVar16 & 7] = UVar22;
      uVar16 = uVar16 + 1;
    } while (uVar9 + uVar6 != uVar16);
  }
  local_98 = (BYTE *)(srcSize + (long)src);
  local_50 = rep;
  if (piVar13 < local_80) {
    local_58 = ((int)local_48 - (int)local_68) + local_58;
    local_40 = local_48 + -(ulong)local_58;
    local_70 = (int *)(local_98 + -0x20);
    do {
      iend = (int *)((long)piVar13 + 1);
      uVar6 = (((int)piVar13 - (int)pBVar2) - UVar23) + 1;
      piVar15 = (int *)(pBVar2 + uVar6);
      if (uVar6 < (uint)local_88) {
        piVar15 = (int *)(local_48 + (uVar6 - local_58));
      }
      UVar22 = UVar23;
      if ((uVar6 - (uint)local_88 < 0xfffffffd) && (*piVar15 == *iend)) {
        pBVar10 = local_98;
        if (uVar6 < (uint)local_88) {
          pBVar10 = local_68;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar13 + 5),(BYTE *)(piVar15 + 1),local_98,pBVar10,
                           local_60);
        uVar16 = sVar7 + 4;
        UVar19 = 1;
LAB_01d2c3c7:
        uVar14 = (long)iend - (long)src;
        pBVar10 = seqStore->lit;
        if (local_70 < iend) {
          ZSTD_safecopyLiterals(pBVar10,(BYTE *)src,(BYTE *)iend,(BYTE *)local_70);
LAB_01d2c3ec:
          seqStore->lit = seqStore->lit + uVar14;
          psVar8 = seqStore->sequences;
          if (0xffff < uVar14) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar10 = *src;
          *(undefined8 *)(pBVar10 + 8) = uVar5;
          pBVar10 = seqStore->lit;
          if (0x10 < uVar14) {
            uVar5 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar10 + 0x18) = uVar5;
            if (0x20 < (long)uVar14) {
              lVar12 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar5 = puVar1[1];
                pBVar11 = pBVar10 + lVar12 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar5;
                lVar12 = lVar12 + 0x20;
              } while (pBVar11 + 0x20 < pBVar10 + uVar14);
            }
            goto LAB_01d2c3ec;
          }
          seqStore->lit = pBVar10 + uVar14;
          psVar8 = seqStore->sequences;
        }
        psVar8->litLength = (U16)uVar14;
        psVar8->offBase = UVar19;
        if (0xffff < uVar16 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8->mlBase = (U16)(uVar16 - 3);
        seqStore->sequences = psVar8 + 1;
        if (ms->lazySkipping != 0) {
          uVar6 = ms->nextToUpdate;
          uVar14 = (ulong)uVar6;
          uVar9 = ((int)local_80 - (int)(pBVar2 + uVar14)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_80 < pBVar2 + uVar14) {
            uVar9 = 0;
          }
          if (uVar6 < uVar9 + uVar6) {
            UVar23 = ms->rowHashLog;
            uVar21 = ms->hashSalt;
            local_54 = 0x18 - UVar23;
            do {
              if (local_8c == 5) {
                uVar20 = *(long *)(pBVar2 + uVar14) * -0x30e4432345000000;
LAB_01d2c55f:
                UVar19 = (U32)((uVar20 ^ uVar21) >> (0x38U - (char)UVar23 & 0x3f));
              }
              else {
                if (local_8c == 6) {
                  uVar20 = *(long *)(pBVar2 + uVar14) * -0x30e4432340650000;
                  goto LAB_01d2c55f;
                }
                UVar19 = (*(int *)(pBVar2 + uVar14) * -0x61c8864f ^ (uint)uVar21) >>
                         ((byte)local_54 & 0x1f);
              }
              ms->hashCache[(uint)uVar14 & 7] = UVar19;
              uVar14 = uVar14 + 1;
            } while (uVar9 + uVar6 != uVar14);
          }
          ms->lazySkipping = 0;
        }
        piVar13 = (int *)((long)iend + uVar16);
        src = piVar13;
        UVar23 = UVar22;
        if (piVar13 <= local_80) {
          do {
            UVar19 = local_b0;
            uVar6 = ((int)piVar13 - (int)pBVar2) - UVar19;
            pBVar10 = pBVar2;
            if (uVar6 < (uint)local_88) {
              pBVar10 = local_40;
            }
            src = piVar13;
            UVar23 = UVar22;
            local_b0 = UVar19;
            if ((0xfffffffc < uVar6 - (uint)local_88) || (*(int *)(pBVar10 + uVar6) != *piVar13))
            break;
            pBVar11 = local_98;
            if (uVar6 < (uint)local_88) {
              pBVar11 = local_68;
            }
            sVar7 = ZSTD_count_2segments
                              ((BYTE *)(piVar13 + 1),(BYTE *)((long)(pBVar10 + uVar6) + 4),local_98,
                               pBVar11,local_60);
            pBVar10 = seqStore->lit;
            if (local_70 < piVar13) {
              ZSTD_safecopyLiterals(pBVar10,(BYTE *)piVar13,(BYTE *)piVar13,(BYTE *)local_70);
            }
            else {
              uVar5 = *(undefined8 *)(piVar13 + 2);
              *(undefined8 *)pBVar10 = *(undefined8 *)piVar13;
              *(undefined8 *)(pBVar10 + 8) = uVar5;
            }
            psVar8 = seqStore->sequences;
            psVar8->litLength = 0;
            psVar8->offBase = 1;
            if (0xffff < sVar7 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar8->mlBase = (U16)(sVar7 + 1);
            seqStore->sequences = psVar8 + 1;
            piVar13 = (int *)((long)piVar13 + sVar7 + 4);
            src = piVar13;
            UVar23 = UVar19;
            local_b0 = UVar22;
            UVar22 = UVar19;
          } while (piVar13 <= local_80);
        }
      }
      else {
        local_a0 = 999999999;
        if (local_8c == 6) {
          if (uVar18 == 6) {
            uVar16 = ZSTD_RowFindBestMatch_dictMatchState_6_6(ms,(BYTE *)piVar13,local_98,&local_a0)
            ;
          }
          else if (uVar18 == 5) {
            uVar16 = ZSTD_RowFindBestMatch_dictMatchState_6_5(ms,(BYTE *)piVar13,local_98,&local_a0)
            ;
          }
          else {
            uVar16 = ZSTD_RowFindBestMatch_dictMatchState_6_4(ms,(BYTE *)piVar13,local_98,&local_a0)
            ;
          }
        }
        else if (local_8c == 5) {
          if (uVar18 == 6) {
            uVar16 = ZSTD_RowFindBestMatch_dictMatchState_5_6(ms,(BYTE *)piVar13,local_98,&local_a0)
            ;
          }
          else if (uVar18 == 5) {
            uVar16 = ZSTD_RowFindBestMatch_dictMatchState_5_5(ms,(BYTE *)piVar13,local_98,&local_a0)
            ;
          }
          else {
            uVar16 = ZSTD_RowFindBestMatch_dictMatchState_5_4(ms,(BYTE *)piVar13,local_98,&local_a0)
            ;
          }
        }
        else if (uVar18 == 6) {
          uVar16 = ZSTD_RowFindBestMatch_dictMatchState_4_6(ms,(BYTE *)piVar13,local_98,&local_a0);
        }
        else if (uVar18 == 5) {
          uVar16 = ZSTD_RowFindBestMatch_dictMatchState_4_5(ms,(BYTE *)piVar13,local_98,&local_a0);
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_dictMatchState_4_4(ms,(BYTE *)piVar13,local_98,&local_a0);
        }
        uVar14 = local_a0;
        piVar15 = piVar13;
        if (uVar16 == 0) {
          uVar14 = 1;
          piVar15 = iend;
        }
        iend = piVar15;
        UVar19 = (U32)uVar14;
        if (3 < uVar16) {
          if (3 < local_a0) {
            uVar14 = (long)piVar13 + (-0xfffffffd - (long)(pBVar2 + local_a0));
            pBVar11 = pBVar2;
            pBVar10 = local_60;
            if ((uint)uVar14 < (uint)local_88) {
              pBVar11 = local_40;
              pBVar10 = local_38;
            }
            if ((src < piVar13) && (uVar14 = uVar14 & 0xffffffff, pBVar10 < pBVar11 + uVar14)) {
              pBVar11 = pBVar11 + uVar14;
              do {
                piVar13 = (int *)((long)iend + -1);
                pBVar11 = pBVar11 + -1;
                if ((*(BYTE *)piVar13 != *pBVar11) ||
                   (uVar16 = uVar16 + 1, iend = piVar13, piVar13 <= src)) break;
              } while (pBVar10 < pBVar11);
            }
            UVar22 = UVar19 - 3;
            local_b0 = UVar23;
          }
          goto LAB_01d2c3c7;
        }
        uVar16 = (long)piVar13 - (long)src;
        piVar13 = (int *)((long)piVar13 + (uVar16 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar16);
      }
    } while (piVar13 < local_80);
  }
  *local_50 = UVar23;
  local_50[1] = local_b0;
  return (long)local_98 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}